

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void * lace_worker_thread(void *arg)

{
  uint uVar1;
  Worker **ppWVar2;
  uint32_t uVar3;
  WorkerP *self_00;
  Task *__lace_dq_head;
  WorkerP *__lace_worker;
  uint uStack_70;
  int worker;
  void *arg_local;
  Worker *res;
  int i;
  uint n;
  uint32_t seed;
  Worker **victim;
  Worker **self;
  atomic_int *paStack_20;
  int worker_id;
  Task *local_18;
  WorkerP *local_10;
  
  uStack_70 = (uint)arg;
  lace_init_worker(uStack_70);
  lace_pin_worker();
  sem_wait((sem_t *)&suspend_semaphore);
  LOCK();
  workers_running = workers_running + 1;
  UNLOCK();
  self_00 = lace_get_worker();
  local_18 = lace_get_head(self_00);
  uVar1 = n_workers;
  paStack_20 = &lace_quits;
  i = (int)self_00->worker;
  _n = workers + i;
  res._4_4_ = 0;
  victim = _n;
  self._4_4_ = i;
  local_10 = self_00;
  while (*paStack_20 == 0) {
    if (1 < uVar1) {
      if ((int)res._4_4_ < 1) {
        res._4_4_ = rng((uint32_t *)&i,0x28);
        ppWVar2 = workers;
        uVar3 = rng((uint32_t *)&i,uVar1 - 1);
        _n = ppWVar2 + (ulong)(uVar3 + self._4_4_ + 1) % (ulong)uVar1;
      }
      else {
        res._4_4_ = res._4_4_ - 1;
        ppWVar2 = _n + 1;
        if (_n + 1 == victim) {
          ppWVar2 = _n + 2;
        }
        _n = ppWVar2;
        if (workers + uVar1 <= _n) {
          _n = workers;
        }
        if (_n == victim) {
          _n = _n + 1;
        }
      }
      lace_steal(local_10,local_18,*_n);
    }
    if (lace_newframe.t != (Task *)0x0) {
      lace_yield(local_10,local_18);
    }
    if (external_task != (ExtTask *)0x0) {
      lace_steal_external(local_10,local_18);
    }
    if (must_suspend != 0) {
      LOCK();
      workers_running = workers_running - 1;
      UNLOCK();
      sem_wait((sem_t *)&suspend_semaphore);
      lace_barrier();
      LOCK();
      workers_running = workers_running + 1;
      UNLOCK();
    }
  }
  LOCK();
  workers_running = workers_running - 1;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void*
lace_worker_thread(void* arg)
{
    int worker = (int)(size_t)arg;

    // Initialize data structures
    lace_init_worker(worker);

    // Pin CPU
    lace_pin_worker();

    // Wait for the first time we are resumed
    sem_wait(&suspend_semaphore);

    // Signal that we are running
    workers_running += 1;

    // Run the steal loop
    WorkerP *__lace_worker = lace_get_worker();
    Task *__lace_dq_head = lace_get_head(__lace_worker);
    lace_steal_loop_WORK(__lace_worker, __lace_dq_head, &lace_quits);

    // Time worker exit event
    lace_time_event(__lace_worker, 9);

    // Signal that we stopped
    workers_running -= 1;

    return NULL;
}